

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.hh
# Opt level: O2

void __thiscall QPDFTokenizer::Token::~Token(Token *this)

{
  std::__cxx11::string::~string((string *)&this->error_message);
  std::__cxx11::string::~string((string *)&this->raw_value);
  std::__cxx11::string::~string((string *)&this->value);
  return;
}

Assistant:

Token() :
            type(tt_bad)
        {
        }